

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

Point2f __thiscall pbrt::HaltonSampler::Get2D(HaltonSampler *this)

{
  DigitPermutation *pDVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Tuple2<pbrt::Point2,_float> TVar10;
  float fVar11;
  float fVar12;
  undefined1 in_ZMM4 [64];
  undefined1 in_XMM5 [16];
  
  if (this->dimension != 0) {
    if (0x3e6 < this->dimension) {
      this->dimension = 2;
    }
    lVar6 = (long)this->dimension;
    this->dimension = this->dimension + 2;
    uVar4 = (this->haltonPixelIndexer).sampleIndex;
    pDVar1 = this->digitPermutations->ptr;
    uVar8 = (ulong)(int)(&Primes)[lVar6];
    fVar11 = 1.0;
    lVar9 = 0;
    iVar5 = 0;
    uVar7 = uVar4;
    do {
      lVar9 = (ulong)pDVar1[lVar6].permutations[iVar5 * pDVar1[lVar6].base + (int)(uVar7 % uVar8)] +
              lVar9 * uVar8;
      fVar11 = (1.0 / (float)(int)(&Primes)[lVar6]) * fVar11;
      iVar5 = iVar5 + 1;
      uVar7 = uVar7 / uVar8;
    } while (1.0 - fVar11 < 1.0);
    auVar2 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,lVar9);
    uVar7 = (ulong)(int)(&DAT_02c82fd4)[lVar6];
    fVar12 = 1.0;
    lVar9 = 0;
    iVar5 = 0;
    do {
      lVar9 = (ulong)pDVar1[lVar6 + 1].permutations
                     [iVar5 * pDVar1[lVar6 + 1].base + (int)(uVar4 % uVar7)] + lVar9 * uVar7;
      fVar12 = (1.0 / (float)(int)(&DAT_02c82fd4)[lVar6]) * fVar12;
      iVar5 = iVar5 + 1;
      uVar4 = uVar4 / uVar7;
    } while (1.0 - fVar12 < 1.0);
    auVar2 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar11 * auVar2._0_4_)));
    auVar3 = vcvtusi2ss_avx512f(in_XMM5,lVar9);
    auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(fVar12 * auVar3._0_4_)));
    auVar2 = vinsertps_avx(auVar2,auVar3,0x10);
    return (Point2f)auVar2._0_8_;
  }
  this->dimension = 2;
  TVar10 = (Tuple2<pbrt::Point2,_float>)HaltonPixelIndexer::SampleFirst2D(&this->haltonPixelIndexer)
  ;
  return (Point2f)TVar10;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        if (dimension == 0) {
            dimension += 2;
            return haltonPixelIndexer.SampleFirst2D();
        } else {
            if (dimension + 1 >= PrimeTableSize)
                dimension = 2;

            int dim = dimension;
            dimension += 2;
            return {ScrambledRadicalInverse(dim, haltonPixelIndexer.SampleIndex(),
                                            (*digitPermutations)[dim]),
                    ScrambledRadicalInverse(dim + 1, haltonPixelIndexer.SampleIndex(),
                                            (*digitPermutations)[dim + 1])};
        }
    }